

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

int Cec_ManChoiceComputation_int(Gia_Man_t *pAig,Cec_ParChc_t *pPars)

{
  long lVar1;
  Vec_Int_t *pVVar2;
  Cec_ParChc_t *pCVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  abctime aVar9;
  Cec_ManSim_t *p;
  abctime aVar10;
  Gia_Man_t *p_00;
  abctime aVar11;
  long lVar12;
  abctime clk;
  abctime clk2;
  abctime clkTotal;
  abctime clkSrm;
  abctime clkSim;
  abctime clkSat;
  int RetValue;
  int r;
  Gia_Man_t *pSrm;
  Cec_ManSim_t *pSim;
  Cec_ParSat_t *pParsSat;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t *pParsSim;
  Cec_ParSim_t ParsSim;
  Vec_Int_t *vCexStore;
  Vec_Int_t *vOutputs;
  Vec_Str_t *vStatus;
  Cec_ParChc_t *pCStack_18;
  int nItersMax;
  Cec_ParChc_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  vStatus._4_4_ = 1000;
  ParsSat._24_8_ = &pParsSim;
  clkSim = 0;
  clkSrm = 0;
  clkTotal = 0;
  pCStack_18 = pPars;
  pPars_local = (Cec_ParChc_t *)pAig;
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  lVar12._0_4_ = pPars_local[5].nRounds;
  lVar12._4_4_ = pPars_local[5].nBTLimit;
  if (lVar12 != 0) {
    free(*(void **)&pPars_local[5].nRounds);
    pPars_local[5].nRounds = 0;
    pPars_local[5].nBTLimit = 0;
  }
  lVar1._0_4_ = pPars_local[5].fUseRings;
  lVar1._4_4_ = pPars_local[5].fUseCSat;
  if (lVar1 != 0) {
    free(*(void **)&pPars_local[5].fUseRings);
    pPars_local[5].fUseRings = 0;
    pPars_local[5].fUseCSat = 0;
  }
  Gia_ManRandom(1);
  Cec_ManSimSetDefaultParams((Cec_ParSim_t *)ParsSat._24_8_);
  *(int *)ParsSat._24_8_ = pCStack_18->nWords;
  *(int *)(ParsSat._24_8_ + 4) = pCStack_18->nRounds;
  *(int *)(ParsSat._24_8_ + 0x2c) = pCStack_18->fVerbose;
  *(undefined4 *)(ParsSat._24_8_ + 0x20) = 0;
  *(undefined4 *)(ParsSat._24_8_ + 0x1c) = 0;
  p = Cec_ManSimStart((Gia_Man_t *)pPars_local,(Cec_ParSim_t *)ParsSat._24_8_);
  Cec_ManSimClassesPrepare(p,-1);
  Cec_ManSimClassesRefine(p);
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)&pParsSat);
  pParsSat._0_4_ = pCStack_18->nBTLimit;
  ParsSat.fCheckMiter = pCStack_18->fVerbose;
  if (pCStack_18->fVerbose != 0) {
    uVar4 = Gia_ManObjNum((Gia_Man_t *)pPars_local);
    uVar5 = Gia_ManAndNum((Gia_Man_t *)pPars_local);
    Abc_Print(1,"Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",(ulong)uVar4,
              (ulong)uVar5,(ulong)(uint)pCStack_18->nBTLimit,(ulong)(uint)pCStack_18->fUseRings,
              pCStack_18->fUseCSat);
    pCVar3 = pPars_local;
    aVar10 = Abc_Clock();
    Cec_ManRefinedClassPrintStats((Gia_Man_t *)pCVar3,(Vec_Str_t *)0x0,0,aVar10 - aVar9);
  }
  clkSat._4_4_ = 0;
  do {
    if (vStatus._4_4_ <= clkSat._4_4_) {
LAB_0075515d:
      if (clkSat._4_4_ == vStatus._4_4_) {
        Abc_Print(1,"The refinement was not finished. The result may be incorrect.\n");
      }
      Cec_ManSimStop(p);
      aVar9 = Abc_Clock();
      lVar12 = aVar9 - aVar8;
      if (pCStack_18->fVerbose != 0) {
        Abc_PrintTimeP(1,"Srm  ",clkTotal,lVar12);
        Abc_PrintTimeP(1,"Sat  ",clkSim,lVar12);
        Abc_PrintTimeP(1,"Sim  ",clkSrm,lVar12);
        Abc_PrintTimeP(1,"Other",((lVar12 - clkSim) - clkTotal) - clkSrm,lVar12);
        Abc_PrintTime(1,"TOTAL",lVar12);
      }
      return 0;
    }
    aVar9 = Abc_Clock();
    aVar10 = Abc_Clock();
    p_00 = Cec_ManCombSpecReduce((Gia_Man_t *)pPars_local,&vCexStore,pCStack_18->fUseRings);
    iVar6 = Gia_ManRegNum(p_00);
    if (iVar6 != 0) {
LAB_00754ed3:
      __assert_fail("Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecChoice.c"
                    ,0xf5,"int Cec_ManChoiceComputation_int(Gia_Man_t *, Cec_ParChc_t *)");
    }
    iVar6 = Gia_ManCiNum(p_00);
    iVar7 = Gia_ManCiNum((Gia_Man_t *)pPars_local);
    if (iVar6 != iVar7) goto LAB_00754ed3;
    aVar11 = Abc_Clock();
    clkTotal = (aVar11 - aVar10) + clkTotal;
    iVar6 = Gia_ManCoNum(p_00);
    pCVar3 = pPars_local;
    if (iVar6 == 0) {
      if (pCStack_18->fVerbose != 0) {
        aVar10 = Abc_Clock();
        Cec_ManRefinedClassPrintStats
                  ((Gia_Man_t *)pCVar3,(Vec_Str_t *)0x0,clkSat._4_4_ + 1,aVar10 - aVar9);
      }
      Vec_IntFree(vCexStore);
      Gia_ManStop(p_00);
      goto LAB_0075515d;
    }
    aVar10 = Abc_Clock();
    if (pCStack_18->fUseCSat == 0) {
      ParsSim._40_8_ = Cec_ManSatSolveMiter(p_00,(Cec_ParSat_t *)&pParsSat,(Vec_Str_t **)&vOutputs);
    }
    else {
      ParsSim._40_8_ = Cbs_ManSolveMiterNc(p_00,pCStack_18->nBTLimit,(Vec_Str_t **)&vOutputs,0);
    }
    Gia_ManStop(p_00);
    aVar11 = Abc_Clock();
    clkSim = (aVar11 - aVar10) + clkSim;
    iVar6 = Vec_IntSize((Vec_Int_t *)ParsSim._40_8_);
    pCVar3 = pPars_local;
    pVVar2 = vOutputs;
    if (iVar6 == 0) {
      if (pCStack_18->fVerbose != 0) {
        aVar10 = Abc_Clock();
        Cec_ManRefinedClassPrintStats
                  ((Gia_Man_t *)pCVar3,(Vec_Str_t *)pVVar2,clkSat._4_4_ + 1,aVar10 - aVar9);
      }
      Vec_IntFree((Vec_Int_t *)ParsSim._40_8_);
      Vec_StrFree((Vec_Str_t *)vOutputs);
      Vec_IntFree(vCexStore);
      goto LAB_0075515d;
    }
    aVar10 = Abc_Clock();
    Cec_ManResimulateCounterExamplesComb(p,(Vec_Int_t *)ParsSim._40_8_);
    Vec_IntFree((Vec_Int_t *)ParsSim._40_8_);
    aVar11 = Abc_Clock();
    clkSrm = (aVar11 - aVar10) + clkSrm;
    Gia_ManCheckRefinements
              ((Gia_Man_t *)pPars_local,(Vec_Str_t *)vOutputs,vCexStore,p,pCStack_18->fUseRings);
    pCVar3 = pPars_local;
    pVVar2 = vOutputs;
    if (pCStack_18->fVerbose != 0) {
      aVar10 = Abc_Clock();
      Cec_ManRefinedClassPrintStats
                ((Gia_Man_t *)pCVar3,(Vec_Str_t *)pVVar2,clkSat._4_4_ + 1,aVar10 - aVar9);
    }
    Vec_StrFree((Vec_Str_t *)vOutputs);
    Vec_IntFree(vCexStore);
    clkSat._4_4_ = clkSat._4_4_ + 1;
  } while( true );
}

Assistant:

int Cec_ManChoiceComputation_int( Gia_Man_t * pAig, Cec_ParChc_t * pPars )
{
    int nItersMax = 1000;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int r, RetValue;
    abctime clkSat = 0, clkSim = 0, clkSrm = 0, clkTotal = Abc_Clock();
    abctime clk2, clk = Abc_Clock();
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    Gia_ManRandom( 1 );
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr   = 0;
    pParsSim->fSeqSimulate = 0;
    // create equivalence classes of registers
    pSim = Cec_ManSimStart( pAig, pParsSim );
    Cec_ManSimClassesPrepare( pSim, -1 );
    Cec_ManSimClassesRefine( pSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Obj = %7d. And = %7d. Conf = %5d. Ring = %d. CSat = %d.\n",
            Gia_ManObjNum(pAig), Gia_ManAndNum(pAig), pPars->nBTLimit, pPars->fUseRings, pPars->fUseCSat );
        Cec_ManRefinedClassPrintStats( pAig, NULL, 0, Abc_Clock() - clk );
    }
    // perform refinement of equivalence classes
    for ( r = 0; r < nItersMax; r++ )
    { 
        clk = Abc_Clock();
        // perform speculative reduction
        clk2 = Abc_Clock();
        pSrm = Cec_ManCombSpecReduce( pAig, &vOutputs, pPars->fUseRings );
        assert( Gia_ManRegNum(pSrm) == 0 && Gia_ManCiNum(pSrm) == Gia_ManCiNum(pAig) );
        clkSrm += Abc_Clock() - clk2;
        if ( Gia_ManCoNum(pSrm) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, NULL, r+1, Abc_Clock() - clk );
            Vec_IntFree( vOutputs );
            Gia_ManStop( pSrm );            
            break;
        }
//Gia_DumpAiger( pSrm, "choicesrm", r, 2 );
        // found counter-examples to speculation
        clk2 = Abc_Clock();
        if ( pPars->fUseCSat )
            vCexStore = Cbs_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        Gia_ManStop( pSrm );
        clkSat += Abc_Clock() - clk2;
        if ( Vec_IntSize(vCexStore) == 0 )
        {
            if ( pPars->fVerbose )
                Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
            Vec_IntFree( vCexStore );
            Vec_StrFree( vStatus );
            Vec_IntFree( vOutputs );
            break;
        }
        // refine classes with these counter-examples
        clk2 = Abc_Clock();
        RetValue = Cec_ManResimulateCounterExamplesComb( pSim, vCexStore );
        Vec_IntFree( vCexStore );
        clkSim += Abc_Clock() - clk2;
        Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, r+1, Abc_Clock() - clk );
        Vec_StrFree( vStatus );
        Vec_IntFree( vOutputs );
//Gia_ManEquivPrintClasses( pAig, 1, 0 );
    }
    // check the overflow
    if ( r == nItersMax )
        Abc_Print( 1, "The refinement was not finished. The result may be incorrect.\n" );
    Cec_ManSimStop( pSim );
    clkTotal = Abc_Clock() - clkTotal;
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_PrintTimeP( 1, "Srm  ", clkSrm,                        clkTotal );
        Abc_PrintTimeP( 1, "Sat  ", clkSat,                        clkTotal );
        Abc_PrintTimeP( 1, "Sim  ", clkSim,                        clkTotal );
        Abc_PrintTimeP( 1, "Other", clkTotal-clkSat-clkSrm-clkSim, clkTotal );
        Abc_PrintTime( 1, "TOTAL",  clkTotal );
    }
    return 0;
}